

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O3

int EVP_PKEY_keygen(EVP_PKEY_CTX *ctx,EVP_PKEY **ppkey)

{
  int iVar1;
  EVP_PKEY *pEVar2;
  code *pcVar3;
  int line;
  
  if (((ctx == (EVP_PKEY_CTX *)0x0) || (*(long *)ctx == 0)) ||
     (pcVar3 = *(code **)(*(long *)ctx + 0x20), pcVar3 == (code *)0x0)) {
    iVar1 = 0x7d;
    line = 0x176;
  }
  else {
    if (*(int *)(ctx + 0x20) == 4) {
      if (ppkey == (EVP_PKEY **)0x0) {
        return 0;
      }
      pEVar2 = *ppkey;
      if (pEVar2 == (EVP_PKEY *)0x0) {
        pEVar2 = EVP_PKEY_new();
        *ppkey = pEVar2;
        if (pEVar2 == (EVP_PKEY *)0x0) {
          iVar1 = 6;
          line = 0x185;
          goto LAB_00189aa3;
        }
        pcVar3 = *(code **)(*(long *)ctx + 0x20);
      }
      iVar1 = (*pcVar3)(ctx,pEVar2);
      if (iVar1 != 0) {
        return 1;
      }
      EVP_PKEY_free(*ppkey);
      *ppkey = (EVP_PKEY *)0x0;
      return 0;
    }
    iVar1 = 0x7e;
    line = 0x17a;
  }
LAB_00189aa3:
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                ,line);
  return 0;
}

Assistant:

int EVP_PKEY_keygen(EVP_PKEY_CTX *ctx, EVP_PKEY **out_pkey) {
  if (!ctx || !ctx->pmeth || !ctx->pmeth->keygen) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
    return 0;
  }
  if (ctx->operation != EVP_PKEY_OP_KEYGEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATON_NOT_INITIALIZED);
    return 0;
  }

  if (!out_pkey) {
    return 0;
  }

  if (!*out_pkey) {
    *out_pkey = EVP_PKEY_new();
    if (!*out_pkey) {
      OPENSSL_PUT_ERROR(EVP, ERR_LIB_EVP);
      return 0;
    }
  }

  if (!ctx->pmeth->keygen(ctx, *out_pkey)) {
    EVP_PKEY_free(*out_pkey);
    *out_pkey = NULL;
    return 0;
  }
  return 1;
}